

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::operator==
          (Dynamic_Object_Function *this,Proxy_Function_Base *f)

{
  __type_conflict1 _Var1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Dynamic_Object_Function *df;
  uint7 in_stack_ffffffffffffffc0;
  byte bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  bool local_1;
  
  if (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __dynamic_cast(in_RSI,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  }
  if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_1 = false;
  }
  else {
    _Var1 = std::operator==(local_38,in_RSI);
    bVar5 = 0;
    if (_Var1) {
      peVar3 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(ulong)in_stack_ffffffffffffffc0);
      peVar4 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT17(bVar5,in_stack_ffffffffffffffc0));
      iVar2 = (*peVar3->_vptr_Proxy_Function_Base[2])(peVar3,peVar4);
      bVar5 = (byte)iVar2;
    }
    local_1 = (bool)(bVar5 & 1);
  }
  return local_1;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &f) const CHAISCRIPT_OVERRIDE
          {
            if (const auto *df = dynamic_cast<const Dynamic_Object_Function *>(&f))
            {
              return df->m_type_name == m_type_name && (*df->m_func) == (*m_func);
            } else {
              return false;
            }
          }